

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

char __thiscall Analyser::analyse_expression(Analyser *this)

{
  optional<Token> next;
  _Storage<Token,_false> local_70;
  char local_50;
  _Storage<Token,_false> local_48;
  
  analyse_multiplicative_expression(this);
  nextToken((optional<Token> *)&local_70._M_value,this);
  do {
    if (local_50 != '\x01') {
LAB_0010f8cf:
      std::_Optional_payload_base<Token>::_M_reset
                ((_Optional_payload_base<Token> *)&local_70._M_value);
      return 'i';
    }
    if (local_70._M_value._type == PLUS_SIGN) {
      analyse_multiplicative_expression(this);
      local_48._0_8_ = 1;
      local_48._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      addInstruction(this,(Instruction *)&local_48._M_value);
    }
    else {
      if (local_70._M_value._type != MINUS_SIGN) {
        unreadToken(this);
        goto LAB_0010f8cf;
      }
      analyse_multiplicative_expression(this);
      local_48._0_8_ = 2;
      local_48._M_value._value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
      addInstruction(this,(Instruction *)&local_48._M_value);
    }
    nextToken((optional<Token> *)&local_48._M_value,this);
    std::_Optional_payload_base<Token>::_M_move_assign
              ((_Optional_payload_base<Token> *)&local_70._M_value,
               (_Optional_payload_base<Token> *)&local_48._M_value);
    std::_Optional_payload_base<Token>::_M_reset
              ((_Optional_payload_base<Token> *)&local_48._M_value);
  } while( true );
}

Assistant:

char Analyser::analyse_expression() {
	analyse_multiplicative_expression();
	auto next = nextToken();

	while (next.has_value()) {
		auto type = next.value().GetType();
		switch (type)
		{
		case TokenType::PLUS_SIGN:
			analyse_multiplicative_expression();
			addInstruction(Instruction(Operation::iadd));
			break;
		case TokenType::MINUS_SIGN:
			analyse_multiplicative_expression();
			addInstruction(Instruction(Operation::isub));
			break;
		default:
			unreadToken();
			return 'i';
		}
		next = nextToken();
	}

	return 'i';
}